

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O0

void __thiscall
cmCPackNSISGenerator::CreateMenuLinks
          (cmCPackNSISGenerator *this,ostringstream *str,ostringstream *deleteStr)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  size_type sVar6;
  reference pbVar7;
  allocator local_459;
  undefined1 local_458 [8];
  string desktop;
  string linkName;
  undefined1 local_410 [7];
  bool url;
  string sourceName;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e0;
  iterator it;
  string local_3d0 [32];
  undefined1 local_3b0 [8];
  ostringstream cmCPackLog_msg_1;
  allocator local_231;
  string local_230;
  undefined1 local_210 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cpackMenuLinksVector;
  ostringstream local_1d8 [8];
  ostringstream cmCPackLog_msg;
  allocator local_49;
  string local_48;
  char *local_28;
  char *cpackMenuLinks;
  ostringstream *deleteStr_local;
  ostringstream *str_local;
  cmCPackNSISGenerator *this_local;
  
  cpackMenuLinks = (char *)deleteStr;
  deleteStr_local = str;
  str_local = (ostringstream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"CPACK_NSIS_MENU_LINKS",&local_49);
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (pcVar4 != (char *)0x0) {
    local_28 = pcVar4;
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    poVar5 = std::operator<<((ostream *)local_1d8,"The cpackMenuLinks: ");
    poVar5 = std::operator<<(poVar5,local_28);
    poVar5 = std::operator<<(poVar5,".");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,599,pcVar4);
    std::__cxx11::string::~string
              ((string *)
               &cpackMenuLinksVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_210);
    pcVar4 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,pcVar4,&local_231);
    cmSystemTools::ExpandListArgument
              (&local_230,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_210,false);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_210);
    if ((sVar6 & 1) == 0) {
      if ((CreateMenuLinks(std::__cxx11::ostringstream&,std::__cxx11::ostringstream&)::urlRegex ==
           '\0') &&
         (iVar3 = __cxa_guard_acquire(&CreateMenuLinks(std::__cxx11::ostringstream&,std::__cxx11::ostringstream&)
                                       ::urlRegex), iVar3 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  (&CreateMenuLinks::urlRegex,"^(mailto:|(ftps?|https?|news)://).*$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&CreateMenuLinks::urlRegex,
                     &__dso_handle);
        __cxa_guard_release(&CreateMenuLinks(std::__cxx11::ostringstream&,std::__cxx11::ostringstream&)
                             ::urlRegex);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::__normal_iterator(&local_3e0);
      local_3e0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_210);
      while( true ) {
        sourceName.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_210);
        bVar2 = __gnu_cxx::operator!=
                          (&local_3e0,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&sourceName.field_2 + 8));
        if (!bVar2) break;
        pbVar7 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_3e0);
        std::__cxx11::string::string((string *)local_410,(string *)pbVar7);
        bVar2 = cmsys::RegularExpression::find(&CreateMenuLinks::urlRegex,(string *)local_410);
        if (!bVar2) {
          cmsys::SystemTools::ReplaceString((string *)local_410,"/","\\");
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_3e0);
        pbVar7 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_3e0);
        std::__cxx11::string::string((string *)(desktop.field_2._M_local_buf + 8),(string *)pbVar7);
        if (bVar2) {
          poVar5 = std::operator<<((ostream *)deleteStr_local,
                                   "  WriteINIStr \"$SMPROGRAMS\\$STARTMENU_FOLDER\\");
          poVar5 = std::operator<<(poVar5,(string *)(desktop.field_2._M_local_buf + 8));
          poVar5 = std::operator<<(poVar5,".url\" \"InternetShortcut\" \"URL\" \"");
          poVar5 = std::operator<<(poVar5,(string *)local_410);
          poVar5 = std::operator<<(poVar5,"\"");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<((ostream *)cpackMenuLinks,"  Delete \"$SMPROGRAMS\\$MUI_TEMP\\");
          poVar5 = std::operator<<(poVar5,(string *)(desktop.field_2._M_local_buf + 8));
          poVar5 = std::operator<<(poVar5,".url\"");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else {
          poVar5 = std::operator<<((ostream *)deleteStr_local,
                                   "  CreateShortCut \"$SMPROGRAMS\\$STARTMENU_FOLDER\\");
          poVar5 = std::operator<<(poVar5,(string *)(desktop.field_2._M_local_buf + 8));
          poVar5 = std::operator<<(poVar5,".lnk\" \"$INSTDIR\\");
          poVar5 = std::operator<<(poVar5,(string *)local_410);
          poVar5 = std::operator<<(poVar5,"\"");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<((ostream *)cpackMenuLinks,"  Delete \"$SMPROGRAMS\\$MUI_TEMP\\");
          poVar5 = std::operator<<(poVar5,(string *)(desktop.field_2._M_local_buf + 8));
          poVar5 = std::operator<<(poVar5,".lnk\"");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_458,"CPACK_CREATE_DESKTOP_LINK_",&local_459);
        std::allocator<char>::~allocator((allocator<char> *)&local_459);
        std::__cxx11::string::operator+=
                  ((string *)local_458,(string *)(desktop.field_2._M_local_buf + 8));
        bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)local_458);
        if (bVar2) {
          std::operator<<((ostream *)deleteStr_local,"  StrCmp \"$INSTALL_DESKTOP\" \"1\" 0 +2\n");
          poVar5 = std::operator<<((ostream *)deleteStr_local,"    CreateShortCut \"$DESKTOP\\");
          poVar5 = std::operator<<(poVar5,(string *)(desktop.field_2._M_local_buf + 8));
          poVar5 = std::operator<<(poVar5,".lnk\" \"$INSTDIR\\");
          poVar5 = std::operator<<(poVar5,(string *)local_410);
          poVar5 = std::operator<<(poVar5,"\"");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::operator<<((ostream *)cpackMenuLinks,"  StrCmp \"$INSTALL_DESKTOP\" \"1\" 0 +2\n");
          poVar5 = std::operator<<((ostream *)cpackMenuLinks,"    Delete \"$DESKTOP\\");
          poVar5 = std::operator<<(poVar5,(string *)(desktop.field_2._M_local_buf + 8));
          poVar5 = std::operator<<(poVar5,".lnk\"");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        std::__cxx11::string::~string((string *)local_458);
        std::__cxx11::string::~string((string *)(desktop.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_410);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_3e0);
      }
      it._M_current._4_4_ = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      poVar5 = std::operator<<((ostream *)local_3b0,
                               "CPACK_NSIS_MENU_LINKS should contain pairs of <shortcut target> and <shortcut label>."
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                      ,0x260,pcVar4);
      std::__cxx11::string::~string(local_3d0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      it._M_current._4_4_ = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_210);
  }
  return;
}

Assistant:

void cmCPackNSISGenerator::CreateMenuLinks( std::ostringstream& str,
                                            std::ostringstream& deleteStr)
{
  const char* cpackMenuLinks
    = this->GetOption("CPACK_NSIS_MENU_LINKS");
  if(!cpackMenuLinks)
    {
    return;
    }
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "The cpackMenuLinks: "
                << cpackMenuLinks << "." << std::endl);
  std::vector<std::string> cpackMenuLinksVector;
  cmSystemTools::ExpandListArgument(cpackMenuLinks,
                                    cpackMenuLinksVector);
  if ( cpackMenuLinksVector.size() % 2 != 0 )
    {
    cmCPackLogger(
      cmCPackLog::LOG_ERROR,
      "CPACK_NSIS_MENU_LINKS should contain pairs of <shortcut target> and "
      "<shortcut label>." << std::endl);
    return;
    }

  static cmsys::RegularExpression
    urlRegex("^(mailto:|(ftps?|https?|news)://).*$");

  std::vector<std::string>::iterator it;
  for ( it = cpackMenuLinksVector.begin();
        it != cpackMenuLinksVector.end();
        ++it )
    {
    std::string sourceName = *it;
    const bool url = urlRegex.find(sourceName);

    // Convert / to \ in filenames, but not in urls:
    //
    if(!url)
      {
      cmSystemTools::ReplaceString(sourceName, "/", "\\");
      }

    ++ it;
    std::string linkName = *it;
    if(!url)
      {
      str << "  CreateShortCut \"$SMPROGRAMS\\$STARTMENU_FOLDER\\"
          << linkName << ".lnk\" \"$INSTDIR\\" << sourceName << "\""
          << std::endl;
      deleteStr << "  Delete \"$SMPROGRAMS\\$MUI_TEMP\\" << linkName
                << ".lnk\"" << std::endl;
      }
    else
      {
      str << "  WriteINIStr \"$SMPROGRAMS\\$STARTMENU_FOLDER\\"
          << linkName << ".url\" \"InternetShortcut\" \"URL\" \""
          << sourceName << "\""
          << std::endl;
      deleteStr << "  Delete \"$SMPROGRAMS\\$MUI_TEMP\\" << linkName
                << ".url\"" << std::endl;
      }
    // see if CPACK_CREATE_DESKTOP_LINK_ExeName is on
    // if so add a desktop link
    std::string desktop = "CPACK_CREATE_DESKTOP_LINK_";
    desktop += linkName;
    if(this->IsSet(desktop))
      {
      str << "  StrCmp \"$INSTALL_DESKTOP\" \"1\" 0 +2\n";
      str << "    CreateShortCut \"$DESKTOP\\"
          << linkName << ".lnk\" \"$INSTDIR\\" << sourceName << "\""
          << std::endl;
      deleteStr << "  StrCmp \"$INSTALL_DESKTOP\" \"1\" 0 +2\n";
      deleteStr << "    Delete \"$DESKTOP\\" << linkName
                << ".lnk\"" << std::endl;
      }
    }
}